

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruleset.cpp
# Opt level: O0

int __thiscall Ruleset::getHighestCardID(Ruleset *this,vector<Card,_std::allocator<Card>_> *cards)

{
  bool bVar1;
  reference ppRVar2;
  Rule *rule;
  iterator __end1;
  iterator __begin1;
  vector<Rule_*,_std::allocator<Rule_*>_> *__range1;
  int previous;
  vector<Card,_std::allocator<Card>_> *cards_local;
  Ruleset *this_local;
  
  __range1._4_4_ = 0;
  __end1 = std::vector<Rule_*,_std::allocator<Rule_*>_>::begin(&this->m_ruleInstances);
  rule = (Rule *)std::vector<Rule_*,_std::allocator<Rule_*>_>::end(&this->m_ruleInstances);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Rule_**,_std::vector<Rule_*,_std::allocator<Rule_*>_>_>
                                *)&rule);
    if (!bVar1) break;
    ppRVar2 = __gnu_cxx::__normal_iterator<Rule_**,_std::vector<Rule_*,_std::allocator<Rule_*>_>_>::
              operator*(&__end1);
    __range1._4_4_ = (*(*ppRVar2)->_vptr_Rule[1])(*ppRVar2,(ulong)__range1._4_4_,cards);
    __gnu_cxx::__normal_iterator<Rule_**,_std::vector<Rule_*,_std::allocator<Rule_*>_>_>::operator++
              (&__end1);
  }
  return __range1._4_4_;
}

Assistant:

int Ruleset::getHighestCardID(const std::vector<Card> &cards) {
    int previous = 0;
    for(auto rule : m_ruleInstances){
        previous = rule->getHighestCardID(previous, cards);
    }
    return previous;
}